

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O3

ArrayXd __thiscall ChebTools::ChebyshevExpansion::to_monomial_increasing(ChebyshevExpansion *this)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  __node_base_ptr p_Var4;
  ulong uVar5;
  ulong uVar6;
  char *__function;
  Index index_1;
  ulong uVar7;
  Index extraout_RDX;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_RSI;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ArrayXd AVar11;
  ArrayXd c;
  double *local_50;
  ulong local_48;
  __buckets_ptr local_40;
  ulong local_38;
  
  Eigen::PlainObjectBase<Eigen::Array<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((PlainObjectBase<Eigen::Array<double,_1,1,0,_1,1>> *)&local_50,in_RSI);
  uVar5 = local_48;
  (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  if ((long)local_48 < 0) {
    __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/PlainObjectBase.h"
                  ,0x130,
                  "void Eigen::PlainObjectBase<Eigen::Array<double, -1, 1>>::resize(Index) [Derived = Eigen::Array<double, -1, 1>]"
                 );
  }
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
            ((DenseStorage<double,__1,__1,_1,_0> *)this,local_48,local_48,1);
  uVar7 = (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  if ((long)uVar7 < 0) {
    __function = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Array<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Array<double, -1, 1>]"
    ;
LAB_0010535d:
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x4a,__function);
  }
  pdVar3 = (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  if (1 < uVar7) {
    memset(pdVar3,0,(uVar7 & 0x7ffffffffffffffe) * 8);
  }
  if ((uVar7 & 0x7ffffffffffffffe) != uVar7) {
    memset((void *)((long)pdVar3 + (uVar7 << 3 & 0xfffffffffffffff0)),0,
           (ulong)((uint)(uVar7 << 3) & 8));
  }
  if (((long)local_48 < 1) ||
     ((this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <
      1)) {
    __assert_fail("index >= 0 && index < size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                  ,0x19a,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Array<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Array<double, -1, 1>, Level = 1]"
                 );
  }
  *(this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       *local_50;
  if (1 < uVar5) {
    uVar7 = 1;
    do {
      pdVar3 = local_50;
      if ((long)local_48 <= (long)uVar7) {
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Array<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Array<double, -1, 1>, Level = 1]"
                     );
      }
      MonomialCoefficients::get_coeffs((MonomialCoefficients *)&local_40,0x14f208);
      uVar6 = local_38;
      if ((long)local_38 < 0) {
        __function = 
        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Array<double, -1, 1>]"
        ;
        goto LAB_0010535d;
      }
      if ((this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows <= (long)uVar7) {
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Block.h"
                      ,0x93,
                      "Eigen::Block<Eigen::Array<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Array<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      if (local_38 != uVar7 + 1) {
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/AssignEvaluator.h"
                      ,0x2f2,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Block<Eigen::Array<double, -1, 1>, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, 1>>, const Eigen::Array<double, -1, 1>>, Functor = Eigen::internal::add_assign_op<double, double>]"
                     );
      }
      dVar1 = pdVar3[uVar7];
      pdVar3 = (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      if (((ulong)pdVar3 & 7) == 0) {
        uVar7 = (ulong)((uint)((ulong)pdVar3 >> 3) & 1);
        uVar9 = local_38 - uVar7;
        uVar7 = uVar7 + (long)((int)(((uint)(uVar9 >> 0x1f) & 1) + (int)uVar9) >> 1) * 2;
        uVar8 = 1;
        if (((ulong)pdVar3 >> 3 & 1) != 0) goto LAB_0010526d;
        uVar8 = 0;
      }
      else {
        uVar9 = 0;
        uVar7 = local_38;
        uVar8 = local_38;
LAB_0010526d:
        uVar10 = 0;
        do {
          pdVar3[uVar10] = (double)local_40[uVar10] * dVar1 + pdVar3[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar8 != uVar10);
      }
      if (1 < (long)uVar9) {
        do {
          p_Var4 = (local_40 + uVar8)[1];
          dVar2 = (pdVar3 + uVar8)[1];
          pdVar3[uVar8] = (double)local_40[uVar8] * dVar1 + pdVar3[uVar8];
          (pdVar3 + uVar8)[1] = (double)p_Var4 * dVar1 + dVar2;
          uVar8 = uVar8 + 2;
        } while ((long)uVar8 < (long)uVar7);
      }
      if ((long)uVar7 < (long)local_38) {
        do {
          pdVar3[uVar7] = (double)local_40[uVar7] * dVar1 + pdVar3[uVar7];
          uVar7 = uVar7 + 1;
        } while (local_38 != uVar7);
      }
      free(local_40);
      uVar7 = uVar6;
    } while (uVar6 != uVar5);
  }
  free(local_50);
  AVar11.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  AVar11.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (ArrayXd)AVar11.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::ArrayXd ChebyshevExpansion::to_monomial_increasing() const {
        Eigen::ArrayXd c = coef();
        Eigen::Index N = c.size() - 1; // N is the degree of A
        Eigen::ArrayXd out(N+1); out.setZero();
        out[0] = c[0];
        for (auto i = 1; i <= N; ++i){
            out.head(i+1) += c(i)*get_monomial_from_Cheb_basis(i);
        }
        return out;
    }